

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O0

from_chars_result
duckdb_fast_float::from_chars<double>
          (char *first,char *last,double *value,bool strict,char decimal_separator,chars_format fmt)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  value128 vVar10;
  char cVar11;
  value128 vVar12;
  uint64_t uVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long *plVar19;
  long *plVar20;
  long *plVar21;
  char *pcVar22;
  char *pcVar23;
  ulong uVar24;
  long lVar25;
  byte in_CL;
  double *in_RDX;
  long *in_RSI;
  long *in_RDI;
  char in_R8B;
  uint in_R9D;
  double dVar26;
  undefined1 auVar27 [16];
  from_chars_result fVar28;
  adjusted_mantissa aVar29;
  adjusted_mantissa am;
  parsed_number_string pns;
  from_chars_result answer;
  int64_t skipped_underscores_1;
  char *first_after_period;
  uint64_t minimal_nineteen_digit_integer;
  char *start;
  uint8_t digit_1;
  bool neg_exp;
  char *location_of_e;
  int64_t exp_number;
  uint8_t digit;
  int64_t skipped_underscores;
  int64_t exponent;
  int64_t digit_count;
  char *end_of_integer_part;
  uint64_t i;
  char *start_digits;
  uint64_t val_1;
  uint64_t val_3;
  uint64_t val;
  uint64_t val_2;
  uint64_t mul2;
  uint64_t mul1;
  uint64_t mask;
  uint64_t mul2_1;
  uint64_t mul1_1;
  uint64_t mask_1;
  int upperbit_1;
  bool inside_safe_exponent_1;
  value128 product_1;
  int lz_1;
  adjusted_mantissa answer_5;
  int upperbit;
  bool inside_safe_exponent;
  value128 product;
  int lz;
  adjusted_mantissa answer_2;
  uint64_t word;
  value128 secondproduct;
  uint64_t precision_mask;
  int index;
  value128 firstproduct;
  __uint128_t r_1;
  value128 answer_4;
  __uint128_t r;
  value128 answer_3;
  value128 secondproduct_1;
  uint64_t precision_mask_1;
  int index_1;
  value128 firstproduct_1;
  __uint128_t r_3;
  value128 answer_7;
  __uint128_t r_2;
  value128 answer_6;
  double local_620;
  double *in_stack_fffffffffffffa20;
  uint64_t uVar30;
  char *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  bool local_4f1;
  bool local_431;
  adjusted_mantissa local_3f0;
  ulong local_3e0;
  uint local_3d8;
  adjusted_mantissa local_3d0;
  char *local_3c0;
  char *local_3b8;
  long *local_3b0;
  byte local_3a8;
  char local_3a7;
  byte local_3a6;
  long *local_3a0;
  errc local_398;
  byte local_389;
  double *local_388;
  long *local_370;
  errc local_368;
  long local_360;
  long *local_358;
  undefined8 local_350;
  long *local_348;
  byte local_33a;
  char local_339;
  long *local_338;
  long local_330;
  byte local_321;
  long local_320;
  char *local_318;
  long local_310;
  long *local_308;
  char *in_stack_fffffffffffffd00;
  long *in_stack_fffffffffffffd08;
  long *local_2d8;
  byte local_1f4;
  adjusted_mantissa local_1e0;
  char *local_1d0;
  int local_1c4;
  uint local_1c0;
  bool local_1b9;
  value128 local_1b8;
  uint local_1a4;
  char *local_1a0;
  char *local_198;
  adjusted_mantissa local_190;
  char *local_180;
  int local_174;
  double local_170;
  double *local_168;
  byte local_159;
  ulong local_158;
  uint local_150;
  value128 local_148;
  undefined8 local_138;
  int local_12c;
  char *local_128;
  char *local_120;
  value128 local_118;
  value128 local_108;
  ulong local_f8;
  char *local_f0;
  value128 local_e8;
  value128 local_d8;
  ulong local_c8;
  char *local_c0;
  value128 local_b8;
  value128 local_a8;
  undefined8 local_98;
  int local_8c;
  ulong local_88;
  char *local_80;
  value128 local_78;
  value128 local_68;
  ulong local_58;
  ulong local_50;
  value128 local_48;
  value128 local_38;
  ulong local_20;
  ulong local_18;
  value128 local_10;
  
  local_389 = in_CL & 1;
  if (in_RDI == in_RSI) {
    local_368 = invalid_argument;
    local_370 = in_RDI;
    goto LAB_0034071f;
  }
  local_3a7 = '\0';
  local_3a6 = 0;
  local_3a8 = (char)*in_RDI == '-';
  local_2d8 = in_RDI;
  if (((char)*in_RDI != '-') ||
     ((local_2d8 = (long *)((long)in_RDI + 1), local_2d8 != in_RSI &&
      ((local_431 = '/' < *(char *)local_2d8 && *(char *)local_2d8 < ':', local_431 ||
       (*(char *)local_2d8 == in_R8B)))))) {
    in_stack_fffffffffffffd08 = local_2d8;
    in_stack_fffffffffffffd00 = (char *)0x0;
    plVar21 = local_2d8;
    while( true ) {
      do {
        local_2d8 = plVar21;
        plVar21 = local_2d8;
        if ((local_2d8 == in_RSI) || ((char)*local_2d8 < '0' || '9' < (char)*local_2d8)) {
          local_308 = local_2d8;
          local_310 = (long)local_2d8 - (long)in_stack_fffffffffffffd08;
          local_318 = (char *)0x0;
          if ((local_2d8 == in_RSI) || ((char)*local_2d8 != in_R8B)) goto LAB_0033ec47;
          plVar19 = (long *)((long)local_2d8 + 1);
          if (((long *)((long)local_2d8 + 9) <= in_RSI) &&
             (((*plVar19 + 0x4646464646464646U | *plVar19 + 0xcfcfcfcfcfcfcfd0U) &
              0x8080808080808080) == 0)) {
            uVar24 = (*plVar19 + 0xcfcfcfcfcfcfcfd0U) * 10 + (*plVar19 + 0xcfcfcfcfcfcfcfd0U >> 8);
            in_stack_fffffffffffffd00 =
                 (char *)((long)in_stack_fffffffffffffd00 * 100000000 +
                         ((uVar24 & 0xff000000ff) * 0xf424000000064 +
                          (uVar24 >> 0x10 & 0xff000000ff) * 0x271000000001 >> 0x20));
            plVar19 = (long *)((long)local_2d8 + 9);
            if (((long *)((long)local_2d8 + 0x11) <= in_RSI) &&
               (((*plVar19 + 0x4646464646464646U | *plVar19 + 0xcfcfcfcfcfcfcfd0U) &
                0x8080808080808080) == 0)) {
              uVar24 = (*plVar19 + 0xcfcfcfcfcfcfcfd0U) * 10 + (*plVar19 + 0xcfcfcfcfcfcfcfd0U >> 8)
              ;
              in_stack_fffffffffffffd00 =
                   (char *)((long)in_stack_fffffffffffffd00 * 100000000 +
                           ((uVar24 & 0xff000000ff) * 0xf424000000064 +
                            (uVar24 >> 0x10 & 0xff000000ff) * 0x271000000001 >> 0x20));
              plVar19 = (long *)((long)local_2d8 + 0x11);
            }
          }
          local_2d8 = plVar19;
          local_320 = 0;
          plVar19 = local_2d8;
          goto LAB_0033ea8e;
        }
        in_stack_fffffffffffffd00 =
             (char *)((long)in_stack_fffffffffffffd00 * 10 + (long)((char)*local_2d8 + -0x30));
        plVar21 = (long *)((long)local_2d8 + 1);
      } while ((plVar21 == in_RSI) || (*(char *)plVar21 != '_'));
      if (local_389 != 0) break;
      plVar21 = (long *)((long)local_2d8 + 2);
      if ((plVar21 == in_RSI) || (*(char *)plVar21 < '0' || '9' < *(char *)plVar21))
      goto LAB_0033f4b0;
    }
    local_3a7 = '\0';
  }
  goto LAB_0033f4b0;
LAB_0033eb76:
  plVar19 = (long *)((long)local_2d8 + 2);
  local_320 = local_320 + 1;
  if ((plVar19 == in_RSI) || (*(char *)plVar19 < '0' || '9' < *(char *)plVar19)) goto LAB_0033f4b0;
LAB_0033ea8e:
  local_2d8 = plVar19;
  if ((local_2d8 != in_RSI) && ('/' < (char)*local_2d8 && (char)*local_2d8 < ':')) {
    local_321 = (char)*local_2d8 - 0x30;
    plVar19 = (long *)((long)local_2d8 + 1);
    in_stack_fffffffffffffd00 = (char *)((long)in_stack_fffffffffffffd00 * 10 + (ulong)local_321);
    if ((plVar19 != in_RSI) && (*(char *)plVar19 == '_')) {
      if (local_389 == 0) goto LAB_0033eb76;
      local_3a7 = '\0';
      goto LAB_0033f4b0;
    }
    goto LAB_0033ea8e;
  }
  local_318 = (char *)((long)plVar21 + local_320 + (1 - (long)local_2d8));
  local_310 = local_310 - (long)local_318;
LAB_0033ec47:
  plVar19 = local_2d8;
  if (local_310 != 0) {
    local_330 = 0;
    if ((((in_R9D & 1) == 0) || (local_2d8 == in_RSI)) ||
       (((char)*local_2d8 != 'e' && ((char)*local_2d8 != 'E')))) {
      local_2d8 = plVar19;
      if ((in_R9D & 1) != 0) goto joined_r0x0033efab;
LAB_0033efb4:
      local_3b0 = local_2d8;
      local_3a7 = '\x01';
      if (0x13 < local_310) {
        local_348 = in_stack_fffffffffffffd08;
        while( true ) {
          bVar14 = false;
          if ((local_348 != in_RSI) && (bVar14 = true, (char)*local_348 != '0')) {
            bVar14 = (char)*local_348 == in_R8B;
          }
          if (!bVar14) break;
          if ((char)*local_348 == '0') {
            local_310 = local_310 + -1;
          }
          local_348 = (long *)((long)local_348 + 1);
        }
        if (0x13 < local_310) {
          local_3a6 = 1;
          in_stack_fffffffffffffd00 = (char *)0x0;
          local_350 = 1000000000000000000;
          plVar19 = in_stack_fffffffffffffd08;
          while ((local_2d8 = plVar19,
                 in_stack_fffffffffffffd00 < (char *)0xde0b6b3a7640000 && local_2d8 != in_RSI &&
                 ('/' < (char)*local_2d8 && (char)*local_2d8 < ':'))) {
            in_stack_fffffffffffffd00 =
                 (char *)((long)in_stack_fffffffffffffd00 * 10 + (long)((char)*local_2d8 + -0x30));
            plVar19 = (long *)((long)local_2d8 + 1);
            if ((plVar19 != in_RSI) && (*(char *)plVar19 == '_')) {
              if (local_389 != 0) {
                local_3a7 = '\0';
                goto LAB_0033f4b0;
              }
              plVar19 = (long *)((long)local_2d8 + 2);
              if ((plVar19 == in_RSI) || (*(char *)plVar19 < '0' || '9' < *(char *)plVar19)) {
                local_3a7 = '\0';
                goto LAB_0033f4b0;
              }
            }
          }
          if (in_stack_fffffffffffffd00 < (char *)0xde0b6b3a7640000) {
            local_358 = (long *)((long)local_2d8 + 1);
            local_360 = 0;
            plVar21 = local_358;
            while ((local_2d8 = plVar21,
                   in_stack_fffffffffffffd00 < (char *)0xde0b6b3a7640000 && local_2d8 != in_RSI &&
                   ('/' < (char)*local_2d8 && (char)*local_2d8 < ':'))) {
              in_stack_fffffffffffffd00 =
                   (char *)((long)in_stack_fffffffffffffd00 * 10 + (long)((char)*local_2d8 + -0x30))
              ;
              plVar21 = (long *)((long)local_2d8 + 1);
              if ((plVar21 != in_RSI) && (*(char *)plVar21 == '_')) {
                plVar21 = (long *)((long)local_2d8 + 2);
                local_360 = local_360 + 1;
                if ((plVar21 == in_RSI) || (*(char *)plVar21 < '0' || '9' < *(char *)plVar21)) {
                  local_3a7 = '\0';
                  goto LAB_0033f4b0;
                }
              }
            }
            local_318 = (char *)((long)local_358 + local_360 + (local_330 - (long)local_2d8));
          }
          else {
            local_318 = (char *)((long)plVar21 + (local_330 - (long)local_2d8));
          }
        }
      }
      local_3b8 = in_stack_fffffffffffffd00;
      local_3c0 = local_318;
      in_stack_fffffffffffffd00 = local_3b8;
    }
    else {
      local_338 = local_2d8;
      plVar20 = (long *)((long)local_2d8 + 1);
      local_339 = '\0';
      if ((plVar20 == in_RSI) || (*(char *)plVar20 != '-')) {
        if ((plVar20 != in_RSI) && (*(char *)plVar20 == '+')) {
          plVar20 = (long *)((long)local_2d8 + 2);
        }
      }
      else {
        local_339 = '\x01';
        plVar20 = (long *)((long)local_2d8 + 2);
      }
      local_2d8 = plVar20;
      if ((local_2d8 == in_RSI) ||
         (plVar20 = local_2d8, (char)*local_2d8 < '0' || '9' < (char)*local_2d8)) {
joined_r0x0033efab:
        local_2d8 = plVar19;
        if ((in_R9D & 4) != 0) goto LAB_0033efb4;
      }
      else {
        while( true ) {
          do {
            local_2d8 = plVar20;
            if ((local_2d8 == in_RSI) || ((char)*local_2d8 < '0' || '9' < (char)*local_2d8)) {
              if (local_339 != '\0') {
                local_330 = -local_330;
              }
              local_318 = local_318 + local_330;
              goto LAB_0033efb4;
            }
            local_33a = (char)*local_2d8 - 0x30;
            if (local_330 < 0x10000) {
              local_330 = local_330 * 10 + (ulong)local_33a;
            }
            plVar20 = (long *)((long)local_2d8 + 1);
          } while ((plVar20 == in_RSI) || (*(char *)plVar20 != '_'));
          if (local_389 != 0) break;
          plVar20 = (long *)((long)local_2d8 + 2);
          if ((plVar20 == in_RSI) || (*(char *)plVar20 < '0' || '9' < *(char *)plVar20))
          goto LAB_0033f4b0;
        }
        local_3a7 = '\0';
      }
    }
  }
LAB_0033f4b0:
  if (local_3a7 == '\0') {
    fVar28 = detail::parse_infnan<double>
                       ((char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                        in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    local_370 = (long *)fVar28.ptr;
    local_368 = fVar28.ec;
    goto LAB_0034071f;
  }
  local_398 = 0;
  local_3a0 = local_3b0;
  local_388 = in_RDX;
  iVar15 = binary_format<double>::min_exponent_fast_path();
  pcVar22 = local_3c0;
  if (((((long)iVar15 <= (long)local_3c0) &&
       (iVar15 = binary_format<double>::max_exponent_fast_path(), pcVar23 = local_3b8,
       (long)pcVar22 <= (long)iVar15)) &&
      (pcVar22 = (char *)binary_format<double>::max_mantissa_fast_path(), pcVar23 <= pcVar22)) &&
     ((local_3a6 & 1) == 0)) {
    auVar27._8_4_ = (int)((ulong)local_3b8 >> 0x20);
    auVar27._0_8_ = local_3b8;
    auVar27._12_4_ = 0x45300000;
    *local_388 = (auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_3b8) - 4503599627370496.0);
    if ((long)local_3c0 < 0) {
      dVar1 = *local_388;
      dVar26 = binary_format<double>::exact_power_of_ten(-(long)local_3c0);
      *local_388 = dVar1 / dVar26;
    }
    else {
      dVar1 = *local_388;
      dVar26 = binary_format<double>::exact_power_of_ten((int64_t)local_3c0);
      *local_388 = dVar1 * dVar26;
    }
    if ((local_3a8 & 1) != 0) {
      *local_388 = -*local_388;
    }
    local_370 = local_3a0;
    local_368 = local_398;
    goto LAB_0034071f;
  }
  local_198 = local_3c0;
  local_1a0 = local_3b8;
  adjusted_mantissa::adjusted_mantissa(&local_190);
  pcVar22 = local_198;
  if ((local_1a0 == (char *)0x0) ||
     (iVar15 = binary_format<double>::smallest_power_of_ten(), pcVar23 = local_198,
     (long)pcVar22 < (long)iVar15)) {
    local_190.power2 = 0;
    local_190.mantissa = 0;
  }
  else {
    iVar15 = binary_format<double>::largest_power_of_ten();
    if ((long)iVar15 < (long)pcVar23) {
      local_190.power2 = binary_format<double>::infinite_power();
      local_190.mantissa = 0;
    }
    else {
      local_180 = local_1a0;
      lVar25 = 0x3f;
      if (local_1a0 != (char *)0x0) {
        for (; (ulong)local_1a0 >> lVar25 == 0; lVar25 = lVar25 + -1) {
        }
      }
      local_1a4 = (uint)lVar25 ^ 0x3f;
      local_1a0 = (char *)((long)local_1a0 << ((byte)local_1a4 & 0x3f));
      local_120 = local_198;
      pcVar22 = local_120;
      local_120._0_4_ = (int)local_198;
      local_12c = (int)local_120 * 2 + 0x2ac;
      local_c8 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)local_12c * 8);
      local_128 = local_1a0;
      local_120 = pcVar22;
      local_c0 = local_1a0;
      value128::value128(&local_b8);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_c0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_c8;
      local_d8 = (value128)(auVar2 * auVar6);
      local_138 = 0x1ff;
      local_b8 = local_d8;
      vVar10 = local_d8;
      if ((local_d8.high & 0x1ff) == 0x1ff) {
        local_f8 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)local_12c * 8 + 8);
        local_f0 = local_128;
        local_118 = local_d8;
        value128::value128(&local_e8);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_f0;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_f8;
        local_108 = (value128)(auVar3 * auVar7);
        if (local_108.high + local_118.low < local_108.high) {
          local_118.high = local_118.high + 1;
        }
        vVar10.high = local_118.high;
        vVar10.low = local_108.high + local_118.low;
        local_e8 = local_108;
        local_148 = local_108;
      }
      local_118.high = vVar10.high;
      uVar30 = local_118.high;
      local_118.low = vVar10.low;
      local_118 = vVar10;
      local_1b8 = vVar10;
      if (local_118.low == 0xffffffffffffffff) {
        local_4f1 = -0x1c < (long)local_198 && (long)local_198 < 0x38;
        local_1b9 = local_4f1;
        if (-0x1c >= (long)local_198 || (long)local_198 >= 0x38) {
          local_190.power2 = 0xffffffff;
          goto LAB_0033fe01;
        }
      }
      local_1c0 = vVar10.high._4_4_ >> 0x1f;
      iVar15 = binary_format<double>::mantissa_explicit_bits();
      local_190.mantissa = uVar30 >> ((-(vVar10.high._7_1_ >> 7) - (char)iVar15) + 0x3dU & 0x3f);
      local_174 = (int)local_198;
      iVar15 = (((int)local_198 * 0x3526a >> 0x10) + local_1c0) - local_1a4;
      iVar18 = binary_format<double>::minimum_exponent();
      pcVar22 = local_198;
      local_190.power2 = (iVar15 + 0x3f) - iVar18;
      if (local_190.power2 < 1) {
        if (1 - local_190.power2 < 0x40) {
          local_190.mantissa = local_190.mantissa >> (1U - (char)local_190.power2 & 0x3f);
          uVar24 = (local_190.mantissa & 1) + local_190.mantissa >> 1;
          local_190.mantissa = uVar24;
          iVar15 = binary_format<double>::mantissa_explicit_bits();
          local_190.power2 = (int)((ulong)(1L << ((byte)iVar15 & 0x3f)) <= uVar24);
        }
        else {
          local_190.power2 = 0;
          local_190.mantissa = 0;
        }
      }
      else {
        if (local_1b8.low < 2) {
          iVar15 = binary_format<double>::min_exponent_round_to_even();
          pcVar23 = local_198;
          if ((long)iVar15 <= (long)pcVar22) {
            iVar15 = binary_format<double>::max_exponent_round_to_even();
            uVar30 = local_190.mantissa;
            if (((long)pcVar23 <= (long)iVar15) && ((local_190.mantissa & 3) == 1)) {
              cVar11 = (char)local_1c0;
              iVar15 = binary_format<double>::mantissa_explicit_bits();
              if (uVar30 << ((cVar11 - (char)iVar15) + 0x3dU & 0x3f) == local_1b8.high) {
                local_190.mantissa = local_190.mantissa & 0xfffffffffffffffe;
              }
            }
          }
        }
        uVar24 = (local_190.mantissa & 1) + local_190.mantissa >> 1;
        local_190.mantissa = uVar24;
        iVar15 = binary_format<double>::mantissa_explicit_bits();
        if ((ulong)(2L << ((byte)iVar15 & 0x3f)) <= uVar24) {
          iVar15 = binary_format<double>::mantissa_explicit_bits();
          local_190.mantissa = 1L << ((byte)iVar15 & 0x3f);
          local_190.power2 = local_190.power2 + 1;
        }
        iVar18 = binary_format<double>::mantissa_explicit_bits();
        iVar15 = local_190.power2;
        local_190.mantissa = local_190.mantissa & ~(1L << ((ulong)(byte)iVar18 & 0x3f));
        iVar18 = binary_format<double>::infinite_power();
        if (iVar18 <= iVar15) {
          local_190.power2 = binary_format<double>::infinite_power();
          local_190.mantissa = 0;
        }
      }
    }
  }
LAB_0033fe01:
  pcVar22 = local_3c0;
  local_3d8 = local_190.power2;
  local_3e0 = local_190.mantissa;
  local_3d0.mantissa = local_190.mantissa;
  local_3d0.power2 = local_190.power2;
  if ((local_3a6 & 1) != 0) {
    pcVar23 = local_3b8 + 1;
    adjusted_mantissa::adjusted_mantissa(&local_1e0);
    if (pcVar23 == (char *)0x0) {
LAB_0033febc:
      local_1e0.power2 = 0;
      local_1e0.mantissa = 0;
    }
    else {
      iVar15 = binary_format<double>::smallest_power_of_ten();
      if ((long)pcVar22 < (long)iVar15) goto LAB_0033febc;
      iVar15 = binary_format<double>::largest_power_of_ten();
      if ((long)iVar15 < (long)pcVar22) {
        local_1e0.power2 = binary_format<double>::infinite_power();
        local_1e0.mantissa = 0;
      }
      else {
        lVar25 = 0x3f;
        if (pcVar23 != (char *)0x0) {
          for (; (ulong)pcVar23 >> lVar25 == 0; lVar25 = lVar25 + -1) {
          }
        }
        uVar16 = (uint)lVar25 ^ 0x3f;
        local_1f4 = (byte)uVar16;
        local_88 = (long)pcVar23 << (local_1f4 & 0x3f);
        local_80 = pcVar22;
        local_80._0_4_ = (int)pcVar22;
        iVar15 = (int)local_80;
        local_8c = (int)local_80 * 2 + 0x2ac;
        local_20 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)local_8c * 8);
        local_1d0 = pcVar23;
        local_80 = pcVar22;
        local_18 = local_88;
        value128::value128(&local_10);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_18;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_20;
        local_38 = (value128)(auVar4 * auVar8);
        local_98 = 0x1ff;
        local_10 = local_38;
        vVar12 = local_38;
        if ((local_38.high & 0x1ff) == 0x1ff) {
          local_58 = *(ulong *)(powers_template<void>::power_of_five_128 + (long)local_8c * 8 + 8);
          local_50 = local_88;
          local_78 = local_38;
          value128::value128(&local_48);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_50;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_58;
          local_68 = (value128)(auVar5 * auVar9);
          if (local_68.high + local_78.low < local_68.high) {
            local_78.high = local_78.high + 1;
          }
          vVar12.high = local_78.high;
          vVar12.low = local_68.high + local_78.low;
          local_48 = local_68;
          local_a8 = local_68;
        }
        local_78.high = vVar12.high;
        uVar13 = local_78.high;
        local_78.low = vVar12.low;
        uVar30 = local_78.low;
        local_78 = vVar12;
        if ((local_78.low == 0xffffffffffffffff) && ((long)pcVar22 < -0x1b || 0x37 < (long)pcVar22))
        {
          local_1e0.power2 = 0xffffffff;
        }
        else {
          iVar18 = -(vVar12.high._4_4_ >> 0x1f);
          iVar17 = binary_format<double>::mantissa_explicit_bits();
          local_1e0.mantissa = uVar13 >> ((-(vVar12.high._7_1_ >> 7) - (char)iVar17) + 0x3dU & 0x3f)
          ;
          local_1c4 = iVar15;
          iVar17 = binary_format<double>::minimum_exponent();
          local_1e0.power2 = ((((iVar15 * 0x3526a >> 0x10) + iVar18) - uVar16) + 0x3f) - iVar17;
          if (local_1e0.power2 < 1) {
            if (1 - local_1e0.power2 < 0x40) {
              local_1e0.mantissa = local_1e0.mantissa >> (1U - (char)local_1e0.power2 & 0x3f);
              uVar24 = (local_1e0.mantissa & 1) + local_1e0.mantissa >> 1;
              local_1e0.mantissa = uVar24;
              iVar15 = binary_format<double>::mantissa_explicit_bits();
              local_1e0.power2 = (int)((ulong)(1L << ((byte)iVar15 & 0x3f)) <= uVar24);
            }
            else {
              local_1e0.power2 = 0;
              local_1e0.mantissa = 0;
            }
          }
          else {
            if (uVar30 < 2) {
              iVar15 = binary_format<double>::min_exponent_round_to_even();
              if ((long)iVar15 <= (long)pcVar22) {
                iVar15 = binary_format<double>::max_exponent_round_to_even();
                if (((long)pcVar22 <= (long)iVar15) && ((local_1e0.mantissa & 3) == 1)) {
                  uVar30 = local_1e0.mantissa;
                  iVar15 = binary_format<double>::mantissa_explicit_bits();
                  if (uVar30 << (((char)iVar18 - (char)iVar15) + 0x3dU & 0x3f) == uVar13) {
                    local_1e0.mantissa = local_1e0.mantissa & 0xfffffffffffffffe;
                  }
                }
              }
            }
            uVar24 = (local_1e0.mantissa & 1) + local_1e0.mantissa >> 1;
            local_1e0.mantissa = uVar24;
            iVar15 = binary_format<double>::mantissa_explicit_bits();
            if ((ulong)(2L << ((byte)iVar15 & 0x3f)) <= uVar24) {
              iVar15 = binary_format<double>::mantissa_explicit_bits();
              local_1e0.mantissa = 1L << ((byte)iVar15 & 0x3f);
              local_1e0.power2 = local_1e0.power2 + 1;
            }
            iVar18 = binary_format<double>::mantissa_explicit_bits();
            iVar15 = local_1e0.power2;
            local_1e0.mantissa = local_1e0.mantissa & ~(1L << ((ulong)(byte)iVar18 & 0x3f));
            iVar18 = binary_format<double>::infinite_power();
            if (iVar18 <= iVar15) {
              local_1e0.power2 = binary_format<double>::infinite_power();
              local_1e0.mantissa = 0;
            }
          }
        }
      }
    }
    local_3f0.mantissa = local_1e0.mantissa;
    local_3f0.power2 = local_1e0.power2;
    bVar14 = adjusted_mantissa::operator!=(&local_3d0,&local_3f0);
    if (bVar14) {
      local_3d0.power2 = 0xffffffff;
    }
  }
  if (local_3d0.power2 < 0) {
    aVar29 = parse_long_mantissa<duckdb_fast_float::binary_format<double>>
                       ((char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    local_3d0.mantissa = aVar29.mantissa;
    local_3d0.power2 = aVar29.power2;
  }
  local_158 = local_3d0.mantissa;
  local_150 = local_3d0.power2;
  local_159 = local_3a8 & 1;
  local_168 = local_388;
  local_170 = (double)local_3d0.mantissa;
  lVar25 = (long)local_3d0.power2;
  iVar15 = binary_format<double>::mantissa_explicit_bits();
  local_620 = (double)(lVar25 << ((byte)iVar15 & 0x3f) | (ulong)local_170);
  if ((local_159 & 1) != 0) {
    local_170 = local_620;
    iVar15 = binary_format<double>::sign_index();
    local_620 = (double)((ulong)local_620 | 1L << ((byte)iVar15 & 0x3f));
  }
  *local_168 = local_620;
  local_370 = local_3a0;
  local_368 = local_398;
LAB_0034071f:
  fVar28.ec = local_368;
  fVar28.ptr = (char *)local_370;
  fVar28._12_4_ = 0;
  return fVar28;
}

Assistant:

from_chars_result from_chars(const char *first, const char *last,
                             T &value, bool strict, const char decimal_separator, chars_format fmt
                              /*= chars_format::general*/)  noexcept  {
  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");


  from_chars_result answer;
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string pns = parse_number_string(first, last, decimal_separator, fmt, strict);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }
  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // Next is Clinger's fast path.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && pns.mantissa <=binary_format<T>::max_mantissa_fast_path() && !pns.too_many_digits) {
    value = T(pns.mantissa);
    if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
    else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
    if (pns.negative) { value = -value; }
    return answer;
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am.power2 = -1; // value is invalid.
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = parse_long_mantissa<binary_format<T>>(first,last); }
  detail::to_float(pns.negative, am, value);
  return answer;
}